

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapPromiseInfo *pSVar1;
  SnapPromiseInfo *pSVar2;
  long lVar3;
  uint32 i;
  ulong uVar4;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (sobj1);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (sobj2);
  NSSnapValues::AssertSnapEquivTTDVar_Special(pSVar1->Result,pSVar2->Result,compareMap,L"result");
  TTDCompareMap::DiagnosticAssert
            (compareMap,pSVar1->ResolveReactionCount == pSVar2->ResolveReactionCount);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < pSVar1->ResolveReactionCount; uVar4 = uVar4 + 1) {
    NSSnapValues::AssertSnapEquiv
              ((SnapPromiseReactionInfo *)
               ((long)&pSVar1->ResolveReactions->PromiseReactionId + lVar3),
               (SnapPromiseReactionInfo *)
               ((long)&pSVar2->ResolveReactions->PromiseReactionId + lVar3),compareMap);
    lVar3 = lVar3 + 0x30;
  }
  TTDCompareMap::DiagnosticAssert
            (compareMap,pSVar1->RejectReactionCount == pSVar2->RejectReactionCount);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < pSVar1->RejectReactionCount; uVar4 = uVar4 + 1) {
    NSSnapValues::AssertSnapEquiv
              ((SnapPromiseReactionInfo *)
               ((long)&pSVar1->RejectReactions->PromiseReactionId + lVar3),
               (SnapPromiseReactionInfo *)
               ((long)&pSVar2->RejectReactions->PromiseReactionId + lVar3),compareMap);
    lVar3 = lVar3 + 0x30;
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapPromiseInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapPromiseInfo* promiseInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(sobj1);
            const SnapPromiseInfo* promiseInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(sobj2);

            NSSnapValues::AssertSnapEquivTTDVar_Special(promiseInfo1->Result, promiseInfo2->Result, compareMap, _u("result"));

            compareMap.DiagnosticAssert(promiseInfo1->ResolveReactionCount == promiseInfo2->ResolveReactionCount);
            for(uint32 i = 0; i < promiseInfo1->ResolveReactionCount; ++i)
            {
                NSSnapValues::AssertSnapEquiv(promiseInfo1->ResolveReactions + i, promiseInfo2->ResolveReactions + i, compareMap);
            }

            compareMap.DiagnosticAssert(promiseInfo1->RejectReactionCount == promiseInfo2->RejectReactionCount);
            for(uint32 i = 0; i < promiseInfo1->RejectReactionCount; ++i)
            {
                NSSnapValues::AssertSnapEquiv(promiseInfo1->RejectReactions + i, promiseInfo2->RejectReactions + i, compareMap);
            }
        }